

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * ApprovalTests::StringUtils::trim(string *s)

{
  string *in_RSI;
  string *in_RDI;
  string local_a0 [24];
  string *in_stack_ffffffffffffff78;
  string local_80 [8];
  string *in_stack_ffffffffffffff88;
  string local_50 [32];
  string local_30 [48];
  
  ::std::__cxx11::string::string(local_50,in_RSI);
  leftTrim(in_stack_ffffffffffffff78);
  ::std::__cxx11::string::operator=(in_RSI,local_30);
  ::std::__cxx11::string::~string(local_30);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::string(local_a0,in_RSI);
  rightTrim(in_stack_ffffffffffffff88);
  ::std::__cxx11::string::operator=(in_RSI,local_80);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_a0);
  ::std::__cxx11::string::string(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::trim(std::string s)
    {
        s = leftTrim(s);
        s = rightTrim(s);
        return s;
    }